

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O1

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueSwapFloat64::read
          (PLYValueSwapFloat64 *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined1 *puVar1;
  long *plVar2;
  undefined1 uVar3;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 extraout_AL_01;
  undefined1 extraout_AL_02;
  undefined1 extraout_AL_03;
  undefined1 extraout_AL_04;
  undefined1 extraout_AL_05;
  undefined8 in_RAX;
  undefined7 uVar5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  undefined7 extraout_var_04;
  undefined7 extraout_var_05;
  ssize_t sVar4;
  undefined4 in_register_00000034;
  
  plVar2 = (long *)CONCAT44(in_register_00000034,__fd);
  puVar1 = *(undefined1 **)(CONCAT44(in_register_00000034,__fd) + 0x10);
  if (puVar1 < *(undefined1 **)(CONCAT44(in_register_00000034,__fd) + 0x18)) {
    uVar3 = *puVar1;
    uVar5 = (undefined7)((ulong)in_RAX >> 8);
    plVar2[2] = (long)(puVar1 + 1);
  }
  else {
    (**(code **)(*plVar2 + 0x50))(plVar2);
    uVar3 = extraout_AL;
    uVar5 = extraout_var;
  }
  *(undefined1 *)((long)&this->value + 7) = uVar3;
  puVar1 = (undefined1 *)plVar2[2];
  if (puVar1 < (undefined1 *)plVar2[3]) {
    uVar3 = *puVar1;
    plVar2[2] = (long)(puVar1 + 1);
  }
  else {
    (**(code **)(*plVar2 + 0x50))(plVar2);
    uVar3 = extraout_AL_00;
    uVar5 = extraout_var_00;
  }
  *(undefined1 *)((long)&this->value + 6) = uVar3;
  puVar1 = (undefined1 *)plVar2[2];
  if (puVar1 < (undefined1 *)plVar2[3]) {
    uVar3 = *puVar1;
    plVar2[2] = (long)(puVar1 + 1);
  }
  else {
    (**(code **)(*plVar2 + 0x50))(plVar2);
    uVar3 = extraout_AL_01;
    uVar5 = extraout_var_01;
  }
  *(undefined1 *)((long)&this->value + 5) = uVar3;
  puVar1 = (undefined1 *)plVar2[2];
  if (puVar1 < (undefined1 *)plVar2[3]) {
    uVar3 = *puVar1;
    plVar2[2] = (long)(puVar1 + 1);
  }
  else {
    (**(code **)(*plVar2 + 0x50))(plVar2);
    uVar3 = extraout_AL_02;
    uVar5 = extraout_var_02;
  }
  *(undefined1 *)((long)&this->value + 4) = uVar3;
  puVar1 = (undefined1 *)plVar2[2];
  if (puVar1 < (undefined1 *)plVar2[3]) {
    uVar3 = *puVar1;
    plVar2[2] = (long)(puVar1 + 1);
  }
  else {
    (**(code **)(*plVar2 + 0x50))(plVar2);
    uVar3 = extraout_AL_03;
    uVar5 = extraout_var_03;
  }
  *(undefined1 *)((long)&this->value + 3) = uVar3;
  puVar1 = (undefined1 *)plVar2[2];
  if (puVar1 < (undefined1 *)plVar2[3]) {
    uVar3 = *puVar1;
    plVar2[2] = (long)(puVar1 + 1);
  }
  else {
    (**(code **)(*plVar2 + 0x50))(plVar2);
    uVar3 = extraout_AL_04;
    uVar5 = extraout_var_04;
  }
  *(undefined1 *)((long)&this->value + 2) = uVar3;
  puVar1 = (undefined1 *)plVar2[2];
  if (puVar1 < (undefined1 *)plVar2[3]) {
    uVar3 = *puVar1;
    plVar2[2] = (long)(puVar1 + 1);
  }
  else {
    (**(code **)(*plVar2 + 0x50))(plVar2);
    uVar3 = extraout_AL_05;
    uVar5 = extraout_var_05;
  }
  *(undefined1 *)((long)&this->value + 1) = uVar3;
  puVar1 = (undefined1 *)plVar2[2];
  if (puVar1 < (undefined1 *)plVar2[3]) {
    sVar4 = CONCAT71(uVar5,*puVar1);
    plVar2[2] = (long)(puVar1 + 1);
  }
  else {
    sVar4 = (**(code **)(*plVar2 + 0x50))(plVar2);
  }
  *(char *)&this->value = (char)sVar4;
  return sVar4;
}

Assistant:

void read(std::streambuf *in)
    {
      char *p=reinterpret_cast<char *>(&value);
      p[7]=static_cast<char>(in->sbumpc());
      p[6]=static_cast<char>(in->sbumpc());
      p[5]=static_cast<char>(in->sbumpc());
      p[4]=static_cast<char>(in->sbumpc());
      p[3]=static_cast<char>(in->sbumpc());
      p[2]=static_cast<char>(in->sbumpc());
      p[1]=static_cast<char>(in->sbumpc());
      p[0]=static_cast<char>(in->sbumpc());
    }